

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_103e4::BuildSystemFrontendTest_commandSkipping_Test::TestBody
          (BuildSystemFrontendTest_commandSkipping_Test *this)

{
  TmpDir *this_00;
  SourceMgr *sourceMgr;
  BuildSystemInvocation *invocation;
  FileSystem *pFVar1;
  bool bVar2;
  int iVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *in_R9;
  StringRef s;
  StringRef expected;
  StringRef expected_00;
  BuildSystemFrontend frontend;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  string local_1a8;
  SourceMgr *local_188;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_180;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_178;
  FileInfo local_170;
  TestBuildSystemFrontendDelegate delegate;
  
  s.Length = 0x143;
  s.Data = 
  "\nclient:\n    name: client\n\ntargets:\n    \"\": [\"3\"]\n\ncommands:\n    1:\n        tool: shell\n        outputs: [\"1\"]\n        args: touch 1\n\n    2:\n        tool: shell\n        inputs: [\"1\"]\n        outputs: [\"2\"]\n        args: touch 2\n\n    3:\n        tool: shell\n        inputs: [\"2\"]\n        outputs: [\"3\"]\n        args: touch 3\n"
  ;
  BuildSystemFrontendTest::writeBuildFile(&this->super_BuildSystemFrontendTest,s);
  sourceMgr = &(this->super_BuildSystemFrontendTest).sourceMgr;
  TestBuildSystemFrontendDelegate::TestBuildSystemFrontendDelegate(&delegate,sourceMgr);
  std::__cxx11::string::string((string *)&local_170,"2",(allocator *)&gtest_ar_);
  std::__detail::
  _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)&delegate.commandsToSkip,(value_type *)&local_170);
  std::__cxx11::string::_M_dispose();
  invocation = &(this->super_BuildSystemFrontendTest).invocation;
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
            (&frontend,&delegate.super_BuildSystemFrontendDelegate,invocation,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_178);
  if (local_178._M_head_impl != (FileSystem *)0x0) {
    (*(local_178._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_178._M_head_impl = (FileSystem *)0x0;
  gtest_ar_.success_ =
       llbuild::buildsystem::BuildSystemFrontend::build(&frontend,(StringRef)ZEXT816(0x1dca0f));
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    expected.Length = 0x151;
    expected.Data =
         "\ncommandPreparing: 3\ncommandPreparing: 2\ncommandPreparing: 1\nshouldCommandStart: 1\ncommandStarted: 1\ncommandProcessStarted: 1\ncommandProcessFinished: 1: 0\ncommandFinished: 1: 0\nshouldCommandStart: 2\ncommandFinished: 2: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n"
    ;
    gtest_ar_.success_ = TestBuildSystemFrontendDelegate::checkTrace(&delegate,expected);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      local_188 = sourceMgr;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
               super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
               .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
      this_00 = &(this->super_BuildSystemFrontendTest).tempDir;
      llbuild::TmpDir::str_abi_cxx11_(&local_1a8,this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                     ,&local_1a8,"/1");
      (*pFVar1->_vptr_FileSystem[7])
                (&local_170,pFVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
      bVar2 = llbuild::basic::FileInfo::isMissing(&local_170);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = !bVar2;
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if (!bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
                 super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                 .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
        llbuild::TmpDir::str_abi_cxx11_(&local_1a8,this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar_,&local_1a8,"/2");
        (*pFVar1->_vptr_FileSystem[7])
                  (&local_170,pFVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
        bVar2 = llbuild::basic::FileInfo::isMissing(&local_170);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ = bVar2;
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        if (bVar2) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__2.message_);
          pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
                   super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                   .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
          llbuild::TmpDir::str_abi_cxx11_(&local_1a8,this_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_,&local_1a8,"/3");
          (*pFVar1->_vptr_FileSystem[7])
                    (&local_170,pFVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                    );
          bVar2 = llbuild::basic::FileInfo::isMissing(&local_170);
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__2.success_ = !bVar2;
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          if (!bVar2) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
            llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(&frontend);
            TestBuildSystemFrontendDelegate::~TestBuildSystemFrontendDelegate(&delegate);
            TestBuildSystemFrontendDelegate::TestBuildSystemFrontendDelegate(&delegate,local_188);
            llbuild::basic::createLocalFileSystem();
            llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
                      (&frontend,&delegate.super_BuildSystemFrontendDelegate,invocation,
                       (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                        *)&local_180);
            if (local_180._M_head_impl != (FileSystem *)0x0) {
              (*(local_180._M_head_impl)->_vptr_FileSystem[1])();
            }
            local_180._M_head_impl = (FileSystem *)0x0;
            gtest_ar_.success_ =
                 llbuild::buildsystem::BuildSystemFrontend::build
                           (&frontend,(StringRef)ZEXT816(0x1dca0f));
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (gtest_ar_.success_) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              expected_00.Length = 0x111;
              expected_00.Data =
                   "\ncommandPreparing: 2\nshouldCommandStart: 2\ncommandStarted: 2\ncommandProcessStarted: 2\ncommandProcessFinished: 2: 0\ncommandFinished: 2: 0\ncommandPreparing: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n"
              ;
              gtest_ar_.success_ =
                   TestBuildSystemFrontendDelegate::checkTrace(&delegate,expected_00);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (gtest_ar_.success_) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
                         super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                         .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
                llbuild::TmpDir::str_abi_cxx11_(&local_1a8,this_00);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar_,&local_1a8,"/2");
                (*pFVar1->_vptr_FileSystem[7])
                          (&local_170,pFVar1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar_);
                bVar2 = llbuild::basic::FileInfo::isMissing(&local_170);
                this_01 = &gtest_ar__2.message_;
                gtest_ar__2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__2.success_ = !bVar2;
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                if (bVar2) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_170,(internal *)&gtest_ar__2,
                             (AssertionResult *)
                             "fs->getFileInfo(tempDir.str() + \"/2\").isMissing()","true","false",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_1a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                             ,0x14c,(char *)local_170.device);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_1a8,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
                  std::__cxx11::string::_M_dispose();
                  if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
                  }
                }
                goto LAB_0011d30d;
              }
              testing::Message::Message((Message *)&local_1a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_170,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "delegate.checkTrace(R\"END(\ncommandPreparing: 2\nshouldCommandStart: 2\ncommandStarted: 2\ncommandProcessStarted: 2\ncommandProcessFinished: 2: 0\ncommandFinished: 2: 0\ncommandPreparing: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n)END\")"
                         ,"false","true",in_R9);
              iVar3 = 0x14a;
            }
            else {
              testing::Message::Message((Message *)&local_1a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_170,(internal *)&gtest_ar_,
                         (AssertionResult *)"frontend.build(\"\")","false","true",in_R9);
              iVar3 = 0x13b;
            }
            this_01 = &gtest_ar_.message_;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                       ,iVar3,(char *)local_170.device);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__2,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
            std::__cxx11::string::_M_dispose();
            if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
            }
            goto LAB_0011d30d;
          }
          testing::Message::Message((Message *)&gtest_ar_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_170,(internal *)&gtest_ar__2,
                     (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/3\").isMissing()","true"
                     ,"false",in_R9);
          iVar3 = 0x131;
        }
        else {
          testing::Message::Message((Message *)&gtest_ar_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_170,(internal *)&gtest_ar__2,
                     (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/2\").isMissing()",
                     "false","true",in_R9);
          iVar3 = 0x130;
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_170,(internal *)&gtest_ar__2,
                   (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/1\").isMissing()","true",
                   "false",in_R9);
        iVar3 = 0x12f;
      }
      this_01 = &gtest_ar__2.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,iVar3,(char *)local_170.device);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      std::__cxx11::string::_M_dispose();
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
      goto LAB_0011d30d;
    }
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_170,(internal *)&gtest_ar_,
               (AssertionResult *)
               "delegate.checkTrace(R\"END(\ncommandPreparing: 3\ncommandPreparing: 2\ncommandPreparing: 1\nshouldCommandStart: 1\ncommandStarted: 1\ncommandProcessStarted: 1\ncommandProcessFinished: 1: 0\ncommandFinished: 1: 0\nshouldCommandStart: 2\ncommandFinished: 2: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n)END\")"
               ,"false","true",in_R9);
    iVar3 = 0x12d;
  }
  else {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_170,(internal *)&gtest_ar_,(AssertionResult *)"frontend.build(\"\")"
               ,"false","true",in_R9);
    iVar3 = 0x11b;
  }
  this_01 = &gtest_ar_.message_;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar__2,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
             ,iVar3,(char *)local_170.device);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&local_1a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
  std::__cxx11::string::_M_dispose();
  if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
  }
LAB_0011d30d:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(&frontend);
  TestBuildSystemFrontendDelegate::~TestBuildSystemFrontendDelegate(&delegate);
  return;
}

Assistant:

TEST_F(BuildSystemFrontendTest, commandSkipping) {
  writeBuildFile(R"END(
client:
    name: client

targets:
    "": ["3"]

commands:
    1:
        tool: shell
        outputs: ["1"]
        args: touch 1

    2:
        tool: shell
        inputs: ["1"]
        outputs: ["2"]
        args: touch 2

    3:
        tool: shell
        inputs: ["2"]
        outputs: ["3"]
        args: touch 3
)END");

  {
    TestBuildSystemFrontendDelegate delegate(sourceMgr);
    delegate.commandsToSkip.insert("2");

    BuildSystemFrontend frontend(delegate, invocation, createLocalFileSystem());
    ASSERT_TRUE(frontend.build(""));

    ASSERT_TRUE(delegate.checkTrace(R"END(
commandPreparing: 3
commandPreparing: 2
commandPreparing: 1
shouldCommandStart: 1
commandStarted: 1
commandProcessStarted: 1
commandProcessFinished: 1: 0
commandFinished: 1: 0
shouldCommandStart: 2
commandFinished: 2: 3
shouldCommandStart: 3
commandStarted: 3
commandProcessStarted: 3
commandProcessFinished: 3: 0
commandFinished: 3: 0
)END"));

    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/1").isMissing());
    ASSERT_TRUE(fs->getFileInfo(tempDir.str() + "/2").isMissing());
    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/3").isMissing());
  }

  // If we rebuild incrementally without skipping, we expect to run 2 and
  // re-run 3. 1 doesn't have to run at all, so we don't expect to get asked
  // if it should start.
  {
    TestBuildSystemFrontendDelegate delegate(sourceMgr);

    BuildSystemFrontend frontend(delegate, invocation, createLocalFileSystem());
    ASSERT_TRUE(frontend.build(""));

    ASSERT_TRUE(delegate.checkTrace(R"END(
commandPreparing: 2
shouldCommandStart: 2
commandStarted: 2
commandProcessStarted: 2
commandProcessFinished: 2: 0
commandFinished: 2: 0
commandPreparing: 3
shouldCommandStart: 3
commandStarted: 3
commandProcessStarted: 3
commandProcessFinished: 3: 0
commandFinished: 3: 0
)END"));

    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/2").isMissing());
  }

}